

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  Matrix<float,_4,_3> *mat;
  Matrix<float,_4,_3> *mat_00;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Type in0;
  Vector<float,_3> res;
  float afStack_108 [8];
  Vec4 *local_e8;
  ulong local_e0;
  undefined4 local_d8;
  float local_d0 [4];
  float local_c0 [6];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Matrix<float,_4,_3> local_70;
  Vec4 *local_40;
  float local_38;
  float local_2c [2];
  float local_24;
  float local_20;
  float local_18 [2];
  
  puVar1 = &local_a8;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_a8 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_a0 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_98 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_90 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_88 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_80 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    mat = (Matrix<float,_4,_3> *)&DAT_00000004;
  }
  else {
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    puVar3 = &s_constInMat3x4;
    mat = (Matrix<float,_4,_3> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar2 * 4) = *(undefined4 *)((long)puVar3 + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0xc);
      mat = (Matrix<float,_4,_3> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 3;
    } while (mat != (Matrix<float,_4,_3> *)&DAT_00000004);
  }
  decrement<float,4,3>((Matrix<float,_4,_3> *)&local_40,(MatrixCaseUtils *)&local_a8,mat);
  local_e8 = local_40;
  local_e0 = CONCAT44(local_e0._4_4_,local_38);
  afStack_108[2] = local_2c[0];
  afStack_108[3] = local_2c[1];
  afStack_108[4] = local_24;
  local_70.m_data.m_data[0].m_data[0] = 0.0;
  local_70.m_data.m_data[0].m_data[1] = 0.0;
  local_70.m_data.m_data[0].m_data[2] = 0.0;
  lVar2 = 0;
  do {
    local_70.m_data.m_data[0].m_data[lVar2] =
         *(float *)((long)&local_e8 + lVar2 * 4) + afStack_108[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_108[5] = local_18[0];
  afStack_108[6] = local_18[1];
  afStack_108[7] = local_20;
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  local_c0[2] = 0.0;
  lVar2 = 0;
  do {
    local_c0[lVar2] = local_70.m_data.m_data[0].m_data[lVar2] + afStack_108[lVar2 + 5];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  decrement<float,4,3>(&local_70,(MatrixCaseUtils *)&local_a8,mat_00);
  afStack_108[2] = local_70.m_data.m_data[0].m_data[0];
  afStack_108[3] = local_70.m_data.m_data[0].m_data[1];
  afStack_108[4] = local_70.m_data.m_data[0].m_data[2];
  afStack_108[5] = local_70.m_data.m_data[1].m_data[1];
  afStack_108[6] = local_70.m_data.m_data[1].m_data[2];
  afStack_108[7] = local_70.m_data.m_data[1].m_data[3];
  local_e8 = (Vec4 *)0x0;
  local_e0 = local_e0 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    *(float *)((long)&local_e8 + lVar2 * 4) = afStack_108[lVar2 + 2] + afStack_108[lVar2 + 5];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c0[3] = local_70.m_data.m_data[2].m_data[2];
  local_c0[4] = local_70.m_data.m_data[2].m_data[3];
  local_c0[5] = local_70.m_data.m_data[2].m_data[0];
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  local_d0[2] = 0.0;
  lVar2 = 0;
  do {
    local_d0[lVar2] = *(float *)((long)&local_e8 + lVar2 * 4) + local_c0[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_108[2] = 0.0;
  afStack_108[3] = 0.0;
  afStack_108[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_108[lVar2 + 2] = local_c0[lVar2] + local_d0[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_e8 = &evalCtx->color;
  local_e0 = 0x100000000;
  local_d8 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_e8 + lVar2 * 4)] = afStack_108[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}